

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFiveAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomFiveAction::Pick(BlueRoomFiveAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  ItemWrapper *this_00;
  allocator local_79;
  string local_78 [36];
  itemType local_54;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  BlueRoomFiveAction *local_18;
  BlueRoomFiveAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == TABLET) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    local_4d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"You can\'t pick up the tablet, it is far too heavy.",&local_39);
    ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_38);
    local_4d = 0;
    this_local = (BlueRoomFiveAction *)pAVar2;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == STATUE) {
      local_54 = STATUE;
      this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
      ItemWrapper::setLocation(this_00,BACKPACK);
      pAVar2 = (ActionResults *)operator_new(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_78,"You lift the statue with considerable effort and are now holding it.",
                 &local_79);
      ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_78);
      this_local = (BlueRoomFiveAction *)pAVar2;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else {
      this_local = (BlueRoomFiveAction *)AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * BlueRoomFiveAction::Pick() {
    if(commands->getMainItem() == TABLET) {
       return new ActionResults(CURRENT, "You can't pick up the tablet, it is far too heavy.");
    }

    if(commands->getMainItem() == STATUE){
        itemList->getValue(STATUE)->setLocation(BACKPACK);
        return new ActionResults(CURRENT, "You lift the statue with considerable effort and are now holding it.");
    }
    return AbstractRoomAction::Pick();
}